

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureGLImpl::PipelineResourceSignatureGLImpl
          (PipelineResourceSignatureGLImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceGLImpl *pDeviceGL,PipelineResourceSignatureDesc *Desc,
          PipelineResourceSignatureInternalDataGL *InternalData)

{
  PipelineResourceSignatureInternalDataGL *Serialized;
  PipelineResourceSignatureInternalDataGL *Desc_00;
  IMemoryAllocator *RawAllocator;
  anon_class_8_1_8991fb9c local_90;
  function<unsigned_long_()> local_88;
  anon_class_8_1_8991fb9c local_68;
  function<void_()> local_60;
  PipelineResourceSignatureInternalDataGL *local_30;
  PipelineResourceSignatureInternalDataGL *InternalData_local;
  PipelineResourceSignatureDesc *Desc_local;
  RenderDeviceGLImpl *pDeviceGL_local;
  IReferenceCounters *pRefCounters_local;
  PipelineResourceSignatureGLImpl *this_local;
  
  local_30 = InternalData;
  InternalData_local = (PipelineResourceSignatureInternalDataGL *)Desc;
  Desc_local = (PipelineResourceSignatureDesc *)pDeviceGL;
  pDeviceGL_local = (RenderDeviceGLImpl *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::PipelineResourceSignatureBase
            (&this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,pRefCounters,
             pDeviceGL,Desc,InternalData);
  (this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
  .super_ObjectBase<Diligent::IPipelineResourceSignature>.
  super_RefCountedObject<Diligent::IPipelineResourceSignature>.super_IPipelineResourceSignature.
  super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_013a36d8;
  *(undefined8 *)
   &(this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).field_0xd2 = 0;
  this->m_DynamicUBOMask = 0;
  this->m_DynamicSSBOMask = 0;
  RawAllocator = GetRawAllocator();
  Desc_00 = InternalData_local;
  Serialized = local_30;
  local_68.this = this;
  std::function<void()>::
  function<Diligent::PipelineResourceSignatureGLImpl::PipelineResourceSignatureGLImpl(Diligent::IReferenceCounters*,Diligent::RenderDeviceGLImpl*,Diligent::PipelineResourceSignatureDesc_const&,Diligent::PipelineResourceSignatureInternalDataGL_const&)::__0,void>
            ((function<void()> *)&local_60,&local_68);
  local_90.this = this;
  std::function<unsigned_long()>::
  function<Diligent::PipelineResourceSignatureGLImpl::PipelineResourceSignatureGLImpl(Diligent::IReferenceCounters*,Diligent::RenderDeviceGLImpl*,Diligent::PipelineResourceSignatureDesc_const&,Diligent::PipelineResourceSignatureInternalDataGL_const&)::__1,void>
            ((function<unsigned_long()> *)&local_88,&local_90);
  PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::
  Deserialize<Diligent::PipelineResourceSignatureInternalDataGL>
            (&this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,RawAllocator,
             (PipelineResourceSignatureDesc *)Desc_00,Serialized,true,&local_60,&local_88);
  std::function<unsigned_long_()>::~function(&local_88);
  std::function<void_()>::~function(&local_60);
  return;
}

Assistant:

PipelineResourceSignatureGLImpl::PipelineResourceSignatureGLImpl(IReferenceCounters*                            pRefCounters,
                                                                 RenderDeviceGLImpl*                            pDeviceGL,
                                                                 const PipelineResourceSignatureDesc&           Desc,
                                                                 const PipelineResourceSignatureInternalDataGL& InternalData) :
    TPipelineResourceSignatureBase{pRefCounters, pDeviceGL, Desc, InternalData}
{
    try
    {
        Deserialize(
            GetRawAllocator(), Desc, InternalData, /*CreateImmutableSamplers = */ true,
            [this]() //
            {
                CreateLayout(/*IsSerialized*/ true);
            },
            [this]() //
            {
                return ShaderResourceCacheGL::GetRequiredMemorySize(m_BindingCount);
            });
    }
    catch (...)
    {
        Destruct();
        throw;
    }
}